

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O3

int writeMPS(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
            vector<int,_std::allocator<int>_> *Astart,vector<int,_std::allocator<int>_> *Aindex,
            vector<double,_std::allocator<double>_> *Avalue,
            vector<double,_std::allocator<double>_> *colCost,
            vector<double,_std::allocator<double>_> *colLower,
            vector<double,_std::allocator<double>_> *colUpper,
            vector<double,_std::allocator<double>_> *rowLower,
            vector<double,_std::allocator<double>_> *rowUpper,
            vector<int,_std::allocator<int>_> *integerColumn)

{
  long lVar1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  pointer pdVar5;
  double *pdVar6;
  pointer piVar7;
  int *piVar8;
  vector<int,_std::allocator<int>_> *pvVar9;
  bool bVar10;
  int iVar11;
  FILE *__s;
  ulong uVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  vector<double,_std::allocator<double>_> rhs;
  vector<int,_std::allocator<int>_> r_ty;
  uint local_b4;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_78;
  int *local_60;
  vector<int,_std::allocator<int>_> *local_58;
  value_type_conflict1 local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  printf("writeMPS: Trying to open file %s\n",filename);
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    puts("writeMPS: Not opened file OK");
    return 1;
  }
  puts("writeMPS: Opened file  OK");
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::resize(&local_48,(long)*numRow);
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_78,(long)*numRow,&local_50);
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_98,(long)*numRow,&local_50);
  pcVar14 = "False";
  if (0 < *numRow) {
    pdVar4 = (rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = 0;
    do {
      dVar2 = pdVar4[lVar18];
      dVar3 = pdVar5[lVar18];
      if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
        if (1e+200 <= dVar3) {
          if (-1e+200 < dVar2) {
            local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar18] = 3;
            goto LAB_00154899;
          }
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar18] = 0;
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18] = 0.0;
        }
        else {
          local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar18] = 2;
          local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar18] = dVar3;
          dVar2 = pdVar4[lVar18];
          if (-1e+200 < dVar2) {
            local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar18] = pdVar5[lVar18] - dVar2;
          }
        }
      }
      else {
        local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar18] = 1;
LAB_00154899:
        local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar18] = dVar2;
      }
      lVar18 = lVar18 + 1;
      iVar11 = *numRow;
      uVar12 = (ulong)iVar11;
    } while (lVar18 < (long)uVar12);
    if (0 < iVar11) {
      if ((*local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != 0.0) ||
         (NAN(*local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start))) {
        pcVar15 = "True";
      }
      else {
        uVar17 = 1;
        while (uVar16 = uVar17, uVar12 != uVar16) {
          if ((local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16] != 0.0) ||
             (uVar17 = uVar16 + 1,
             NAN(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar16]))) break;
        }
        pcVar15 = "False";
        if (uVar16 < uVar12) {
          pcVar15 = "True";
        }
      }
      if (iVar11 < 1) {
        bVar20 = false;
      }
      else {
        bVar20 = true;
        if ((*local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start == 0.0) &&
           (!NAN(*local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start))) {
          uVar17 = 1;
          while (uVar16 = uVar17, uVar12 != uVar16) {
            if ((local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar16] != 0.0) ||
               (uVar17 = uVar16 + 1,
               NAN(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar16]))) break;
          }
          bVar20 = uVar16 < uVar12;
        }
      }
      goto LAB_001549be;
    }
  }
  bVar20 = false;
  pcVar15 = "False";
LAB_001549be:
  uVar12 = (ulong)*numCol;
  if ((long)uVar12 < 1) {
    bVar21 = false;
LAB_00154a05:
    pcVar13 = "False";
  }
  else {
    pdVar6 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar2 = *pdVar6;
    pcVar13 = "True";
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      bVar21 = true;
    }
    else {
      bVar21 = true;
      uVar17 = 1;
      while (1e+200 <= (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar17 - 1]) {
        bVar21 = uVar17 < uVar12;
        if (uVar17 == uVar12) goto LAB_00154a05;
        dVar2 = pdVar6[uVar17];
        uVar17 = uVar17 + 1;
        if ((dVar2 != 0.0) || (NAN(dVar2))) break;
      }
    }
  }
  if (bVar20) {
    pcVar14 = "True";
  }
  local_58 = Astart;
  printf("Model: RHS =     %s\n       RANGES =  %s\n       BOUNDS =  %s\n",pcVar15,pcVar14,pcVar13);
  fwrite("NAME\n",5,1,__s);
  fwrite("ROWS\n",5,1,__s);
  fwrite(" N  COST\n",9,1,__s);
  if (0 < *numRow) {
    uVar12 = 0;
    do {
      pcVar14 = " N  R%-7d\n";
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar12] - 1U < 3) {
        pcVar14 = &DAT_0015adec +
                  *(int *)(&DAT_0015adec +
                          (ulong)(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar12] - 1U) * 4);
      }
      uVar12 = uVar12 + 1;
      fprintf(__s,pcVar14,uVar12 & 0xffffffff);
    } while ((long)uVar12 < (long)*numRow);
  }
  local_60 = numRow;
  fwrite("COLUMNS\n",8,1,__s);
  pvVar9 = local_58;
  if (0 < *numCol) {
    bVar19 = false;
    local_b4 = 0;
    lVar18 = 0;
    do {
      if ((integerColumn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar18] == 0) {
        if (bVar19) {
          pcVar14 = "    MARK%04d  \'MARKER\'                 \'INTEND\'\n";
          bVar10 = false;
          goto LAB_00154b9b;
        }
      }
      else {
        pcVar14 = "    MARK%04d  \'MARKER\'                 \'INTORG\'\n";
        bVar10 = true;
        if (!bVar19) {
LAB_00154b9b:
          bVar19 = bVar10;
          fprintf(__s,pcVar14,(ulong)local_b4);
          local_b4 = local_b4 + 1;
        }
      }
      dVar2 = (colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar18];
      lVar1 = lVar18 + 1;
      if ((dVar2 != 0.0) || (NAN(dVar2))) {
        fprintf(__s,"    C%-7d  COST      %12g\n");
      }
      piVar7 = (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar11 = piVar7[lVar18];
      lVar18 = (long)iVar11;
      if (iVar11 < piVar7[lVar1]) {
        do {
          fprintf(__s,"    C%-7d  R%-7d  %12g\n",
                  (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar18],lVar1,
                  (ulong)((Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar18] + 1));
          lVar18 = lVar18 + 1;
        } while (lVar18 < (pvVar9->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar1]);
      }
      lVar18 = lVar1;
    } while (lVar1 < *numCol);
  }
  fwrite("RHS\n",4,1,__s);
  piVar8 = local_60;
  if (0 < *local_60) {
    uVar12 = 0;
    do {
      pdVar6 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar12;
      uVar12 = uVar12 + 1;
      fprintf(__s,"    RHS_V     R%-7d  %12g\n",*pdVar6,uVar12 & 0xffffffff);
    } while ((long)uVar12 < (long)*piVar8);
  }
  if (bVar20) {
    fwrite("RANGES\n",7,1,__s);
    iVar11 = *piVar8;
    if (0 < iVar11) {
      lVar18 = 0;
      do {
        if ((local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar18] != 0.0) ||
           (NAN(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar18]))) {
          fprintf(__s,"    RANGE     R%-7d  %12g\n",(ulong)((int)lVar18 + 1));
          iVar11 = *piVar8;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < iVar11);
    }
  }
  if ((bVar21) && (fwrite("BOUNDS\n",7,1,__s), 0 < *numCol)) {
    lVar18 = 0;
    do {
      dVar2 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar18];
      dVar3 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[lVar18];
      if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
        if (dVar3 < 1e+200) {
          fprintf(__s," UP BOUND     C%-7d  %12g\n",(ulong)((int)lVar18 + 1));
        }
        if (dVar2 <= -1e+200) {
          fprintf(__s," MI BOUND     C%-7d\n",lVar18 + 1U & 0xffffffff);
        }
        else {
          pcVar14 = " LO BOUND     C%-7d  %12g\n";
          if ((dVar2 != 0.0) || (NAN(dVar2))) goto LAB_00154db2;
        }
      }
      else {
        pcVar14 = " FX BOUND     C%-7d  %12g\n";
LAB_00154db2:
        fprintf(__s,pcVar14,dVar2,lVar18 + 1U & 0xffffffff);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < *numCol);
  }
  fwrite("ENDATA\n",7,1,__s);
  fclose(__s);
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int writeMPS(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
	     vector<int>& Astart, vector<int>& Aindex, vector<double>& Avalue,
	     vector<double>& colCost, vector<double>& colLower, vector<double>& colUpper,
	     vector<double>& rowLower, vector<double>& rowUpper,
	     vector<int>& integerColumn) {

#ifdef JAJH_dev
    printf("writeMPS: Trying to open file %s\n", filename);
#endif
    FILE *file = fopen(filename, "w");
    if (file == 0) {
#ifdef JAJH_dev
      printf("writeMPS: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("writeMPS: Opened file  OK\n");
#endif
    vector<int> r_ty;
    vector<double> rhs, ranges;
    bool have_rhs = false;
    bool have_ranges = false;
    bool have_bounds = false;
    r_ty.resize(numRow);
    rhs.assign(numRow, 0);
    ranges.assign(numRow, 0);
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (rowLower[r_n] == rowUpper[r_n]) {
	//Equality constraint - Type E - range = 0
	r_ty[r_n] = MPS_ROW_TY_E;
	rhs[r_n] = rowLower[r_n];
      } else if (!hsol_isInfinity(rowUpper[r_n])) {
	//Upper bounded constraint - Type L
	r_ty[r_n] = MPS_ROW_TY_L;
	rhs[r_n] = rowUpper[r_n];
	if (!hsol_isInfinity(-rowLower[r_n])) {
	  //Boxed constraint - range = u-l
	  ranges[r_n] = rowUpper[r_n]-rowLower[r_n];
	}
      } else if (!hsol_isInfinity(-rowLower[r_n])) {
	//Lower bounded constraint - Type G
	r_ty[r_n] = MPS_ROW_TY_G;
	rhs[r_n] = rowLower[r_n];
      } else {
	//Free constraint - Type N
	r_ty[r_n] = MPS_ROW_TY_N;
	rhs[r_n] = 0;
      }
    }
    
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (rhs[r_n]) {
	have_rhs = true;
	break;
      }
    }
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (ranges[r_n]) {
	have_ranges = true;
	break;
      }
    }
    for (int c_n = 0; c_n < numCol; c_n++) {
      if (colLower[c_n]) {
	have_bounds = true;
	break;
      }
      if (!hsol_isInfinity(colUpper[c_n])) {
	have_bounds = true;
	break;
      }
    }
    printf("Model: RHS =     %s\n       RANGES =  %s\n       BOUNDS =  %s\n",
	   BoolToString(have_rhs), BoolToString(have_ranges), BoolToString(have_bounds));
    
    //Field:    1           2          3         4         5         6
    //Columns:  2-3        5-12      15-22     25-36     40-47     50-61
    //         1         2         3         4         5         6
    //1234567890123456789012345678901234567890123456789012345678901
    //x11x22222222xx33333333xx444444444444xxx55555555xx666666666666
    fprintf(file, "NAME\n");
    fprintf(file, "ROWS\n");
    fprintf(file, " N  COST\n");	
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (r_ty[r_n] == MPS_ROW_TY_E) {
	fprintf(file, " E  R%-7d\n", r_n+1);	
      } else if (r_ty[r_n] == MPS_ROW_TY_G) {
	fprintf(file, " G  R%-7d\n", r_n+1);	
      } else if (r_ty[r_n] == MPS_ROW_TY_L) {
	fprintf(file, " L  R%-7d\n", r_n+1);	
      } else {
	fprintf(file, " N  R%-7d\n", r_n+1);	
      }
    }
    bool integerFg = false;
    int nIntegerMk = 0;
    fprintf(file, "COLUMNS\n");
    for (int c_n = 0; c_n < numCol; c_n++) {
      if (integerColumn[c_n] && !integerFg) {
	//Start an integer section
	fprintf(file, "    MARK%04d  'MARKER'                 'INTORG'\n", nIntegerMk);
	nIntegerMk++;
	integerFg = true;
      } else if (!integerColumn[c_n] && integerFg) {
	//End an integer section
	fprintf(file, "    MARK%04d  'MARKER'                 'INTEND'\n", nIntegerMk);
	nIntegerMk++;
	integerFg = false;
      }
      if (colCost[c_n] != 0) {
	double v = colCost[c_n];
	fprintf(file, "    C%-7d  COST      %12g\n", c_n+1, v);	
      }
      for (int el_n = Astart[c_n]; el_n<Astart[c_n+1]; el_n++) {
	double v = Avalue[el_n];
	int r_n = Aindex[el_n];
	fprintf(file, "    C%-7d  R%-7d  %12g\n", c_n+1, r_n+1, v);	
      }
    }
    have_rhs = true;
    if (have_rhs) {
      fprintf(file, "RHS\n");
      for (int r_n = 0; r_n < numRow; r_n++) {
	double v = rhs[r_n];
	//	if (v !=0)
	  fprintf(file, "    RHS_V     R%-7d  %12g\n", r_n+1, v);
      }
    }
    if (have_ranges) {
      fprintf(file, "RANGES\n");
      for (int r_n = 0; r_n < numRow; r_n++) {
	double v = ranges[r_n];
	if (v !=0) fprintf(file, "    RANGE     R%-7d  %12g\n", r_n+1, v);
      }
    }
    if (have_bounds) {
      fprintf(file, "BOUNDS\n");
      for (int c_n = 0; c_n < numCol; c_n++) {
	double lb = colLower[c_n];
	double ub = colUpper[c_n];
	if (lb == ub) {
	  fprintf(file, " FX BOUND     C%-7d  %12g\n", c_n+1, lb);
	} else {
	  if (!hsol_isInfinity(ub)) {
	    //Upper bounded variable
	    fprintf(file, " UP BOUND     C%-7d  %12g\n", c_n+1, ub);
	  }
	  if (!hsol_isInfinity(-lb)) {
	      //Lower bounded variable - default is 0
	      if (lb) {
		fprintf(file, " LO BOUND     C%-7d  %12g\n", c_n+1, lb);
	      }
	    } else {
	      //Infinite lower bound
	      fprintf(file, " MI BOUND     C%-7d\n", c_n+1);
	  }
	}
      }
    }
    fprintf(file, "ENDATA\n");
    fclose(file);
    return 0;
}